

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_inout_fragment_outputs_copy_to_subpass_inputs(CompilerGLSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  SPIRType *type;
  SPIREntryPoint *this_00;
  Vector<std::function<void_()>_> *this_01;
  anon_class_24_3_a95dc563 local_90;
  function<void_()> local_78;
  SPIRFunction *local_58;
  SPIRFunction *func;
  SPIRVariable *local_40;
  SPIRVariable *output_var;
  SPIRVariable *subpass_var;
  pair<unsigned_int,_unsigned_int> *remap;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1;
  CompilerGLSL *this_local;
  
  __end1 = ::std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin(&this->subpass_to_framebuffer_fetch_attachment);
  remap = (pair<unsigned_int,_unsigned_int> *)
          ::std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::end(&this->subpass_to_framebuffer_fetch_attachment);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&remap);
    if (!bVar1) {
      return;
    }
    subpass_var = (SPIRVariable *)
                  __gnu_cxx::
                  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  ::operator*(&__end1);
    output_var = find_subpass_input_by_attachment_index
                           (this,*(uint32_t *)&(subpass_var->super_IVariant)._vptr_IVariant);
    local_40 = find_color_output_by_location
                         (this,*(uint32_t *)
                                ((long)&(subpass_var->super_IVariant)._vptr_IVariant + 4));
    if (output_var != (SPIRVariable *)0x0) {
      if (local_40 == (SPIRVariable *)0x0) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,
                   "Need to declare the corresponding fragment output variable to be able to read from it."
                  );
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(local_40->super_IVariant).field_0xc);
      type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      bVar1 = Compiler::is_array(&this->super_Compiler,type);
      if (bVar1) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,"Cannot use GL_EXT_shader_framebuffer_fetch with arrays of color outputs."
                  );
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      this_00 = Compiler::get_entry_point(&this->super_Compiler);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)this_00);
      local_58 = Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,uVar2);
      this_01 = &local_58->fixup_hooks_in;
      local_90.subpass_var = output_var;
      local_90.output_var = local_40;
      local_90.this = this;
      ::std::function<void()>::
      function<spirv_cross::CompilerGLSL::emit_inout_fragment_outputs_copy_to_subpass_inputs()::__0,void>
                ((function<void()> *)&local_78,&local_90);
      SmallVector<std::function<void_()>,_0UL>::push_back(this_01,&local_78);
      ::std::function<void_()>::~function(&local_78);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void CompilerGLSL::emit_inout_fragment_outputs_copy_to_subpass_inputs()
{
	for (auto &remap : subpass_to_framebuffer_fetch_attachment)
	{
		auto *subpass_var = find_subpass_input_by_attachment_index(remap.first);
		auto *output_var = find_color_output_by_location(remap.second);
		if (!subpass_var)
			continue;
		if (!output_var)
			SPIRV_CROSS_THROW("Need to declare the corresponding fragment output variable to be able "
			                  "to read from it.");
		if (is_array(get<SPIRType>(output_var->basetype)))
			SPIRV_CROSS_THROW("Cannot use GL_EXT_shader_framebuffer_fetch with arrays of color outputs.");

		auto &func = get<SPIRFunction>(get_entry_point().self);
		func.fixup_hooks_in.push_back([=]() {
			if (is_legacy())
			{
				statement(to_expression(subpass_var->self), " = ", "gl_LastFragData[",
				          get_decoration(output_var->self, DecorationLocation), "];");
			}
			else
			{
				uint32_t num_rt_components = this->get<SPIRType>(output_var->basetype).vecsize;
				statement(to_expression(subpass_var->self), vector_swizzle(num_rt_components, 0), " = ",
				          to_expression(output_var->self), ";");
			}
		});
	}
}